

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O1

void handle_unexpected_msg(atom_server as,char *msg)

{
  ClientData pvVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  Tcl_HashEntry *pTVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  char *__s2;
  char cVar9;
  char local_48;
  char *str;
  uint uVar10;
  
  if (*msg != 'E') {
    printf("Warning: Got an unexpected message \"%s\"\n");
    return;
  }
  lVar4 = strtol(msg + 1,&str,10);
  __s2 = str + 1;
  str = __s2;
  pTVar5 = (*(as->string_hash_table).findProc)(&as->string_hash_table,__s2);
  cVar9 = (char)((ulong)lVar4 >> 0x10);
  uVar10 = (uint)((ulong)lVar4 >> 0x10);
  cVar6 = (char)((ulong)lVar4 >> 8);
  uVar8 = (uint)((ulong)lVar4 >> 8);
  local_48 = (char)((ulong)lVar4 >> 0x18);
  iVar3 = (int)((ulong)lVar4 >> 0x18);
  if (((pTVar5 != (Tcl_HashEntry *)0x0) && (pvVar1 = pTVar5->clientData, pvVar1 != (ClientData)0x0))
     && (uVar7 = (uint)lVar4 & 0xff | (uVar8 & 0xff) << 8 | (uVar10 & 0xff) << 0x10 | iVar3 << 0x18,
        *(uint *)((long)pvVar1 + 8) != uVar7)) {
    puts("Warning:  Atom use inconsistency.");
    printf("\tThis program associates the string \"%s\" with atom value %d, %x, \'%c%c%c%c\'\n",__s2
           ,(ulong)*(uint *)((long)pvVar1 + 8),(ulong)*(uint *)((long)pvVar1 + 8),
           (ulong)(uint)(int)*(char *)((long)pvVar1 + 8),
           (ulong)(uint)(int)*(char *)((long)pvVar1 + 9),
           (ulong)(uint)(int)*(char *)((long)pvVar1 + 10),
           (ulong)(uint)(int)*(char *)((long)pvVar1 + 0xb));
    printf("\tOther programs use the atom value %d, %x, \'%c%c%c%c\'\n",(ulong)uVar7,(ulong)uVar7,
           (ulong)(uint)(int)(char)lVar4,(ulong)(uint)(int)cVar6,(ulong)(uint)(int)cVar9,
           (ulong)(uint)(int)local_48);
  }
  uVar8 = (uint)lVar4 & 0xff | (uVar8 & 0xff) << 8 | (uVar10 & 0xff) << 0x10 | iVar3 << 0x18;
  pTVar5 = (*(as->value_hash_table).findProc)(&as->value_hash_table,(char *)(long)(int)uVar8);
  if (pTVar5 != (Tcl_HashEntry *)0x0) {
    puVar2 = (undefined8 *)pTVar5->clientData;
    if ((puVar2 != (undefined8 *)0x0) && (iVar3 = strcmp((char *)*puVar2,__s2), iVar3 != 0)) {
      puts("Warning:  Atom use inconsistency.");
      printf("\tThis program associates the string \"%s\" with atom value %d, %x, \'%c%c%c%c\'\n",
             *puVar2,(ulong)*(uint *)(puVar2 + 1),(ulong)*(uint *)(puVar2 + 1),
             (ulong)(uint)(int)*(char *)(puVar2 + 1),(ulong)(uint)(int)*(char *)((long)puVar2 + 9),
             (ulong)(uint)(int)*(char *)((long)puVar2 + 10),
             (ulong)(uint)(int)*(char *)((long)puVar2 + 0xb));
      printf("\tOther programs associate the string \"%s\" with that value\n",__s2);
    }
    printf("Atom cache inconsistency, tried to associate value %d %x, \'%c%c%c%c\' with string \"%s\"\n\tPrevious association was string \"%s\"\n"
           ,(ulong)uVar8,(ulong)uVar8,(ulong)(uint)(int)(char)lVar4,(ulong)(uint)(int)cVar6,
           (ulong)(uint)(int)cVar9,(ulong)(uint)(int)local_48,__s2,*puVar2);
  }
  return;
}

Assistant:

static void
handle_unexpected_msg(atom_server as, char *msg)
{
    switch (msg[0]) {
    case 'E':{
	    Tcl_HashEntry *entry = NULL;
	    char *str;
	    int atom;
	    atom = strtol(&msg[1], &str, 10);
	    str++;
	    entry = Tcl_FindHashEntry(&as->string_hash_table, str);
	    if (entry != NULL) {
		send_get_atom_msg_ptr atom_entry =
		(send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
		if ((atom_entry != NULL) && (atom_entry->atom != atom)) {
		    printf("Warning:  Atom use inconsistency.\n");
		    printf("\tThis program associates the string \"%s\" with atom value %d, %x, '%c%c%c%c'\n",
			   str, atom_entry->atom, atom_entry->atom,
			   ((char*)&atom_entry->atom)[0],
			   ((char*)&atom_entry->atom)[1],
			   ((char*)&atom_entry->atom)[2],
			   ((char*)&atom_entry->atom)[3]);
		    printf("\tOther programs use the atom value %d, %x, '%c%c%c%c'\n", atom,
			   atom, ((char*)&atom)[0], ((char*)&atom)[1], 
			((char*)&atom)[2], ((char*)&atom)[3]
			);
		}
	    }
	    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t)atom);
	    if (entry != NULL) {
		send_get_atom_msg_ptr atom_entry =
		(send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
		if ((atom_entry != NULL) &&
		    (strcmp(atom_entry->atom_string, str) != 0)) {
		    printf("Warning:  Atom use inconsistency.\n");
		    printf("\tThis program associates the string \"%s\" with atom value %d, %x, '%c%c%c%c'\n",
			   atom_entry->atom_string, atom_entry->atom,
			   atom_entry->atom, 
			   ((char*)&atom_entry->atom)[0],
			   ((char*)&atom_entry->atom)[1],
			   ((char*)&atom_entry->atom)[2],
			   ((char*)&atom_entry->atom)[3]);
		    printf("\tOther programs associate the string \"%s\" with that value\n", str);
		}
		printf("Atom cache inconsistency, tried to associate value %d %x, '%c%c%c%c' with string \"%s\"\n	Previous association was string \"%s\"\n",
		       atom, atom, ((char*)&atom)[0], ((char*)&atom)[1], 
		       ((char*)&atom)[2], ((char*)&atom)[3], str, atom_entry->atom_string);
	    }
	    break;
	}
    default:
	printf("Warning: Got an unexpected message \"%s\"\n", msg);
    }
}